

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# farchive.cpp
# Opt level: O3

DWORD __thiscall FArchive::ReadCount(FArchive *this)

{
  long in_RAX;
  uint uVar1;
  byte bVar2;
  BYTE in;
  undefined8 uStack_28;
  
  uVar1 = 0;
  bVar2 = 0;
  uStack_28 = in_RAX;
  do {
    (*this->_vptr_FArchive[3])(this,(long)&uStack_28 + 7,1);
    uVar1 = uVar1 | (uStack_28._7_1_ & 0x7f) << (bVar2 & 0x1f);
    bVar2 = bVar2 + 7;
  } while (uStack_28 < 0);
  return uVar1;
}

Assistant:

DWORD FArchive::ReadCount ()
{
	BYTE in;
	DWORD count = 0;
	int ofs = 0;

	do
	{
		Read (&in, sizeof(BYTE));
		count |= (in & 0x7f) << ofs;
		ofs += 7;
	} while (in & 0x80);

	return count;
}